

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::AddVariantChildrenToPrimNode
          (Impl *this,int32_t prim_idx,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren)

{
  size_type sVar1;
  ostream *poVar2;
  mapped_type *this_00;
  ostringstream ss_w;
  string sStack_1c8;
  key_type_conflict1 local_1a8 [94];
  
  if (-1 < prim_idx) {
    local_1a8[0] = prim_idx;
    sVar1 = ::std::
            map<unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
            ::count(&this->_variantChildren,local_1a8);
    if (sVar1 != 0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"AddVariantChildrenToPrimNode");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x17f);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a8,
                                 "Multiple Field with VariantSet SpecType detected.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::stringbuf::str();
      PushWarn(this,&sStack_1c8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    local_1a8[0] = prim_idx;
    this_00 = ::std::
              map<unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
              ::operator[](&this->_variantChildren,local_1a8);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)this_00,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)variantChildren);
  }
  return -1 < prim_idx;
}

Assistant:

bool AddVariantChildrenToPrimNode(
      int32_t prim_idx, const std::vector<value::token> &variantChildren) {
    if (prim_idx < 0) {
      return false;
    }

    if (_variantChildren.count(uint32_t(prim_idx))) {
      PUSH_WARN("Multiple Field with VariantSet SpecType detected.");
    }

    _variantChildren[uint32_t(prim_idx)] = variantChildren;

    return true;
  }